

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  Vec3fa VVar3;
  Vec3fa L;
  AffineSpace3fa space;
  _func_int **local_c0;
  undefined1 local_b8 [34];
  undefined5 uStack_96;
  undefined4 uStack_91;
  undefined1 local_8d;
  float local_88;
  float fStack_84;
  undefined1 auStack_80 [24];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_00 = (XMLLoader *)*in_RDX;
  peVar1 = (element_type *)(local_b8 + 0x20);
  local_b8._32_2_ = 0x6641;
  uStack_96 = 0x53656e6966;
  uStack_91 = 0x65636170;
  local_b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  local_8d = 0;
  local_b8._16_8_ = peVar1;
  XML::child((XML *)local_b8,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,(Ref<embree::XML> *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((element_type *)local_b8._16_8_ != peVar1) {
    operator_delete((void *)local_b8._16_8_);
  }
  childID = (string *)*in_RDX;
  local_b8._32_2_ = 0x4c;
  local_b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_b8._16_8_ = peVar1;
  XML::child((XML *)&local_c0,childID);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)local_b8,(Ref<embree::XML> *)childID);
  if (local_c0 != (_func_int **)0x0) {
    (**(code **)(*local_c0 + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_4_);
  }
  if ((element_type *)local_b8._16_8_ != peVar1) {
    operator_delete((void *)local_b8._16_8_);
  }
  local_28 = local_38 * 0.0 + local_28;
  fStack_24 = fStack_34 * 0.0 + fStack_24;
  fStack_20 = fStack_30 * 0.0 + fStack_20;
  fStack_1c = fStack_2c * 0.0 + fStack_1c;
  local_88 = local_48 * 0.0 + local_28;
  fStack_84 = fStack_44 * 0.0 + fStack_24;
  auStack_80._0_4_ = fStack_40 * 0.0 + fStack_20;
  auStack_80._4_4_ = fStack_3c * 0.0 + fStack_1c;
  local_68 = local_58.m128[0] + local_88;
  fStack_64 = local_58.m128[1] + fStack_84;
  fStack_60 = local_58.m128[2] + (float)auStack_80._0_4_;
  fStack_5c = local_58.m128[3] + (float)auStack_80._4_4_;
  auStack_80._8_4_ = local_28 + local_48 + local_58.m128[0] * 0.0;
  auStack_80._12_4_ = fStack_24 + fStack_44 + local_58.m128[1] * 0.0;
  auStack_80._16_4_ = fStack_20 + fStack_40 + local_58.m128[2] * 0.0;
  auStack_80._20_4_ = fStack_1c + fStack_3c + local_58.m128[3] * 0.0;
  local_88 = local_58.m128[0] * 0.0 + local_88;
  fStack_84 = local_58.m128[1] * 0.0 + fStack_84;
  auStack_80._0_4_ = local_58.m128[2] * 0.0 + (float)auStack_80._0_4_;
  auStack_80._4_4_ = local_58.m128[3] * 0.0 + (float)auStack_80._4_4_;
  pcVar2 = (pointer)alignedMalloc(0xc0,0x10);
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(pointer *)(pcVar2 + 0x10) = pcVar2 + 0x20;
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0x20] = '\0';
  *(pointer *)(pcVar2 + 0x30) = pcVar2 + 0x40;
  pcVar2[0x38] = '\0';
  pcVar2[0x39] = '\0';
  pcVar2[0x3a] = '\0';
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[0x40] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  pcVar2[0x54] = '\0';
  pcVar2[0x55] = '\0';
  pcVar2[0x56] = '\0';
  pcVar2[0x57] = '\0';
  pcVar2[0x58] = '\0';
  pcVar2[0x59] = '\0';
  pcVar2[0x5c] = -1;
  pcVar2[0x5d] = -1;
  pcVar2[0x5e] = -1;
  pcVar2[0x5f] = -1;
  pcVar2[0x60] = '\0';
  pcVar2[0x61] = '\0';
  pcVar2[0x62] = '\0';
  pcVar2[99] = '\0';
  pcVar2[100] = '\0';
  pcVar2[0x65] = '\0';
  pcVar2[0x66] = '\0';
  pcVar2[0x67] = '\0';
  *(undefined ***)pcVar2 = &PTR__Node_002c6fe8;
  pcVar2[0x70] = '\x05';
  pcVar2[0x71] = '\0';
  pcVar2[0x72] = '\0';
  pcVar2[0x73] = '\0';
  *(ulong *)(pcVar2 + 0x80) = CONCAT44(fStack_64,local_68);
  *(ulong *)(pcVar2 + 0x88) = CONCAT44(fStack_5c,fStack_60);
  *(ulong *)(pcVar2 + 0x90) = CONCAT44(auStack_80._12_4_,auStack_80._8_4_);
  *(ulong *)(pcVar2 + 0x98) = CONCAT44(auStack_80._20_4_,auStack_80._16_4_);
  *(ulong *)(pcVar2 + 0xa0) = CONCAT44(fStack_84,local_88);
  *(ulong *)(pcVar2 + 0xa8) = CONCAT44(auStack_80._4_4_,auStack_80._0_4_);
  *(undefined8 *)(pcVar2 + 0xb0) = local_b8._0_8_;
  ((__atomic_base<unsigned_long> *)(pcVar2 + 0xb8))->_M_i = local_b8._8_8_;
  (this->path).filename._M_dataplus._M_p = pcVar2;
  LOCK();
  *(long *)(pcVar2 + 8) = *(long *)(pcVar2 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(1, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(0, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::TriangleLight>(SceneGraph::TriangleLight(v0,v1,v2,L));
  }